

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

int __thiscall QtPrivate::QCalendarModel::columnForDayOfWeek(QCalendarModel *this,DayOfWeek day)

{
  int iVar1;
  int iVar2;
  
  if (day + ~Sunday < 0xfffffff9) {
    return -1;
  }
  iVar2 = day - this->m_firstDay;
  iVar1 = iVar2 + 7;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  return iVar1 + this->m_firstColumn;
}

Assistant:

int QCalendarModel::columnForDayOfWeek(Qt::DayOfWeek day) const
{
    if (day < 1 || unsigned(day) > unsigned(7))
        return -1;
    int column = (int)day - (int)m_firstDay;
    if (column < 0)
        column += 7;
    return column + m_firstColumn;
}